

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s98c.c
# Opt level: O0

int main(int ac,char **av)

{
  char *pcVar1;
  int iVar2;
  FILE *__stream;
  int ret;
  FILE *infp;
  char *inputfile;
  yyscan_t scanner;
  s98c *ctx;
  s98c context;
  char **av_local;
  int ac_local;
  
  scanner = &ctx;
  context.source_encoding = (char *)av;
  memset(scanner,0,0x98);
  if ((ac < 2) || (3 < ac)) {
    fprintf(_stderr,"Usage: %s inputfile.s98ml [outputfile.s98]\nCompiled with iconv support\n",
            *(undefined8 *)context.source_encoding);
    av_local._4_4_ = 1;
  }
  else {
    pcVar1 = *(char **)(context.source_encoding + 8);
    context.source_encoding = context.source_encoding + 8;
    __stream = fopen(pcVar1,"rb");
    if (__stream == (FILE *)0x0) {
      perror(pcVar1);
      av_local._4_4_ = 1;
    }
    else {
      *(char **)((long)scanner + 0x80) = pcVar1;
      if (ac == 3) {
        pcVar1 = context.source_encoding + 8;
        context.source_encoding = context.source_encoding + 8;
        *(undefined8 *)((long)scanner + 0x88) = *(undefined8 *)pcVar1;
      }
      init_context((s98c *)scanner);
      yylex_init(&inputfile);
      yyset_in((FILE *)__stream,inputfile);
      iVar2 = yyparse((s98c *)scanner,inputfile);
      yylex_destroy(inputfile);
      fclose(__stream);
      if (iVar2 == 0) {
        write_s98((s98c *)scanner);
      }
      free_context((s98c *)scanner);
      av_local._4_4_ = 0;
    }
  }
  return av_local._4_4_;
}

Assistant:

int main(int ac, char** av)
{
    struct s98c context;
    struct s98c* ctx = &context;
    yyscan_t scanner;
    char* inputfile;
    FILE* infp;
    int ret;

    memset(ctx, 0, sizeof(struct s98c));

    if(ac < 2 || ac > 3) {
#ifdef HAVE_ICONV
        fprintf(stderr, "Usage: %s inputfile.s98ml [outputfile.s98]\nCompiled with iconv support\n", *av);
#else
        fprintf(stderr, "Usage: %s inputfile.s98ml [outputfile.s98]\nCompiled WITHOUT iconv support (cannot use #encoding)\n", *av);
#endif
        return 1;
    }

    inputfile = *++av;
    infp = fopen(inputfile, "rb");
    if(infp == NULL) {
        perror(inputfile);
        return 1;
    }
    ctx->input_filename = inputfile;

    if(ac == 3) {
        ctx->output_filename = *++av;
    }

    init_context(ctx);

    yylex_init(&scanner);

    yyset_in(infp, scanner);

    ret = yyparse(ctx, scanner);

    yylex_destroy(scanner);

    fclose(infp);

    if(ret == 0) {
        write_s98(ctx);
    }

    free_context(ctx);

    return 0;
}